

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feed.c
# Opt level: O1

int equal_feeds(feed_t *a,feed_t *b)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  long lVar5;
  long lVar6;
  uint uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  if (((((((a->agency_count == b->agency_count) &&
          (uVar4 = uVar3, a->calendar_dates_count == b->calendar_dates_count)) &&
         (a->calendar_records_count == b->calendar_records_count)) &&
        ((a->fare_attributes_count == b->fare_attributes_count &&
         (a->fare_rules_count == b->fare_rules_count)))) &&
       ((a->feed_info_count == b->feed_info_count &&
        ((a->frequencies_count == b->frequencies_count && (a->levels_count == b->levels_count))))))
      && (a->pathways_count == b->pathways_count)) &&
     ((((a->routes_count == b->routes_count && (a->shapes_count == b->shapes_count)) &&
       (a->stop_times_count == b->stop_times_count)) &&
      (((a->stops_count == b->stops_count && (a->transfers_count == b->transfers_count)) &&
       (a->trips_count == b->trips_count)))))) {
    bVar2 = 0 < a->agency_count;
    if (0 < a->agency_count) {
      iVar1 = equal_agency(a->agencies,b->agencies);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0x280;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->agency_count;
          if (a->agency_count <= lVar6) goto LAB_0012e0fa;
          iVar1 = equal_agency((agency_t *)(a->agencies->id + lVar5),
                               (agency_t *)(b->agencies->id + lVar5));
          lVar5 = lVar5 + 0x280;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e0fa:
    bVar2 = 0 < a->calendar_dates_count;
    if (0 < a->calendar_dates_count) {
      iVar1 = equal_calendar_date(a->calendar_dates,b->calendar_dates);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0x50;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->calendar_dates_count;
          if (a->calendar_dates_count <= lVar6) goto LAB_0012e152;
          iVar1 = equal_calendar_date((calendar_date_t *)(a->calendar_dates->service_id + lVar5),
                                      (calendar_date_t *)(b->calendar_dates->service_id + lVar5));
          lVar5 = lVar5 + 0x50;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e152:
    bVar2 = 0 < a->calendar_records_count;
    if (0 < a->calendar_records_count) {
      iVar1 = equal_calendar_record(a->calendar_records,b->calendar_records);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0x70;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->calendar_records_count;
          if (a->calendar_records_count <= lVar6) goto LAB_0012e1aa;
          iVar1 = equal_calendar_record
                            ((calendar_record_t *)(a->calendar_records->service_id + lVar5),
                             (calendar_record_t *)(b->calendar_records->service_id + lVar5));
          lVar5 = lVar5 + 0x70;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e1aa:
    bVar2 = 0 < a->fare_attributes_count;
    if (0 < a->fare_attributes_count) {
      iVar1 = equal_fare_attributes(a->fare_attributes,b->fare_attributes);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0xa0;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->fare_attributes_count;
          if (a->fare_attributes_count <= lVar6) goto LAB_0012e205;
          iVar1 = equal_fare_attributes
                            ((fare_attributes_t *)(a->fare_attributes->fare_id + lVar5),
                             (fare_attributes_t *)(b->fare_attributes->fare_id + lVar5));
          lVar5 = lVar5 + 0xa0;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e205:
    bVar2 = 0 < a->fare_rules_count;
    if (0 < a->fare_rules_count) {
      iVar1 = equal_fare_rule(a->fare_rules,b->fare_rules);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0x140;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->fare_rules_count;
          if (a->fare_rules_count <= lVar6) goto LAB_0012e260;
          iVar1 = equal_fare_rule((fare_rule_t *)(a->fare_rules->fare_id + lVar5),
                                  (fare_rule_t *)(b->fare_rules->fare_id + lVar5));
          lVar5 = lVar5 + 0x140;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e260:
    bVar2 = 0 < a->feed_info_count;
    if (0 < a->feed_info_count) {
      iVar1 = equal_feed_info(a->feed_info,b->feed_info);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0x212;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->feed_info_count;
          if (a->feed_info_count <= lVar6) goto LAB_0012e2bb;
          iVar1 = equal_feed_info((feed_info_t *)(a->feed_info->feed_publisher_name + lVar5),
                                  (feed_info_t *)(b->feed_info->feed_publisher_name + lVar5));
          lVar5 = lVar5 + 0x212;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e2bb:
    bVar2 = 0 < a->frequencies_count;
    if (0 < a->frequencies_count) {
      iVar1 = equal_frequency(a->frequencies,b->frequencies);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0x5c;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->frequencies_count;
          if (a->frequencies_count <= lVar6) goto LAB_0012e313;
          iVar1 = equal_frequency((frequency_t *)(a->frequencies->trip_id + lVar5),
                                  (frequency_t *)(b->frequencies->trip_id + lVar5));
          lVar5 = lVar5 + 0x5c;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e313:
    bVar2 = 0 < a->levels_count;
    if (0 < a->levels_count) {
      iVar1 = equal_level(a->levels,b->levels);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0x88;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->levels_count;
          if (a->levels_count <= lVar6) goto LAB_0012e36e;
          iVar1 = equal_level((level_t *)(a->levels->id + lVar5),(level_t *)(b->levels->id + lVar5))
          ;
          lVar5 = lVar5 + 0x88;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e36e:
    bVar2 = 0 < a->pathways_count;
    if (0 < a->pathways_count) {
      iVar1 = equal_pathway(a->pathways,b->pathways);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0x1e8;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->pathways_count;
          if (a->pathways_count <= lVar6) goto LAB_0012e3db;
          iVar1 = equal_pathway((pathway_t *)(a->pathways->id + lVar5),
                                (pathway_t *)(b->pathways->id + lVar5));
          lVar5 = lVar5 + 0x1e8;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e3db:
    bVar2 = 0 < a->routes_count;
    if (0 < a->routes_count) {
      iVar1 = equal_route(a->routes,b->routes);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0x2d8;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->routes_count;
          if (a->routes_count <= lVar6) goto LAB_0012e448;
          iVar1 = equal_route((route_t *)(a->routes->id + lVar5),(route_t *)(b->routes->id + lVar5))
          ;
          lVar5 = lVar5 + 0x2d8;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e448:
    bVar2 = 0 < a->shapes_count;
    if (0 < a->shapes_count) {
      iVar1 = equal_shape(a->shapes,b->shapes);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0x70;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->shapes_count;
          if (a->shapes_count <= lVar6) goto LAB_0012e4b2;
          iVar1 = equal_shape((shape_t *)(a->shapes->id + lVar5),(shape_t *)(b->shapes->id + lVar5))
          ;
          lVar5 = lVar5 + 0x70;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e4b2:
    bVar2 = 0 < a->stop_times_count;
    if (0 < a->stop_times_count) {
      iVar1 = equal_stop_time(a->stop_times,b->stop_times);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0xf0;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->stop_times_count;
          if (a->stop_times_count <= lVar6) goto LAB_0012e51f;
          iVar1 = equal_stop_time((stop_time_t *)(a->stop_times->trip_id + lVar5),
                                  (stop_time_t *)(b->stop_times->trip_id + lVar5));
          lVar5 = lVar5 + 0xf0;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e51f:
    bVar2 = 0 < a->stops_count;
    if (0 < a->stops_count) {
      iVar1 = equal_stop(a->stops,b->stops);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0x3b0;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->stops_count;
          if (a->stops_count <= lVar6) goto LAB_0012e58c;
          iVar1 = equal_stop((stop_t *)(a->stops->id + lVar5),(stop_t *)(b->stops->id + lVar5));
          lVar5 = lVar5 + 0x3b0;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e58c:
    bVar2 = 0 < a->transfers_count;
    if (0 < a->transfers_count) {
      iVar1 = equal_transfer(a->transfers,b->transfers);
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar5 = 0x88;
        do {
          lVar6 = lVar6 + 1;
          bVar2 = lVar6 < a->transfers_count;
          if (a->transfers_count <= lVar6) goto LAB_0012e5f5;
          iVar1 = equal_transfer((transfer_t *)(a->transfers->from_stop_id + lVar5),
                                 (transfer_t *)(b->transfers->from_stop_id + lVar5));
          lVar5 = lVar5 + 0x88;
        } while (iVar1 != 0);
      }
      if (bVar2) {
        return 0;
      }
    }
LAB_0012e5f5:
    bVar2 = a->trips_count < 1;
    if ((0 < a->trips_count) && (iVar1 = equal_trip(a->trips,b->trips), iVar1 != 0)) {
      lVar6 = 0;
      lVar5 = 0x1cc;
      do {
        lVar6 = lVar6 + 1;
        bVar2 = a->trips_count <= lVar6;
        if (a->trips_count <= lVar6) break;
        iVar1 = equal_trip((trip_t *)(a->trips->route_id + lVar5),
                           (trip_t *)(b->trips->route_id + lVar5));
        lVar5 = lVar5 + 0x1cc;
      } while (iVar1 != 0);
    }
    uVar4 = (uint)bVar2;
  }
  return uVar4;
}

Assistant:

int equal_feeds(const feed_t *a, const feed_t *b) {
    if (a->agency_count != b->agency_count)
        return 0;

    if (a->calendar_dates_count != b->calendar_dates_count)
        return 0;

    if (a->calendar_records_count != b->calendar_records_count)
        return 0;

    if (a->fare_attributes_count != b->fare_attributes_count)
        return 0;

    if (a->fare_rules_count != b->fare_rules_count)
        return 0;

    if (a->feed_info_count != b->feed_info_count)
        return 0;

    if (a->frequencies_count != b->frequencies_count)
        return 0;

    if (a->levels_count != b->levels_count)
        return 0;

    if (a->pathways_count != b->pathways_count)
        return 0;

    if (a->routes_count != b->routes_count)
        return 0;

    if (a->shapes_count != b->shapes_count)
        return 0;

    if (a->stop_times_count != b->stop_times_count)
        return 0;

    if (a->stops_count != b->stops_count)
        return 0;

    if (a->transfers_count != b->transfers_count)
        return 0;

    if (a->trips_count != b->trips_count)
        return 0;


    for (int i = 0; i < a->agency_count; i++)
        if (!equal_agency(&(a->agencies[i]), &(b->agencies[i])))
            return 0;

    for (int i = 0; i < a->calendar_dates_count; i++)
        if (!equal_calendar_date(&(a->calendar_dates[i]), &(b->calendar_dates[i])))
            return 0;

    for (int i = 0; i < a->calendar_records_count; i++)
        if (!equal_calendar_record(&(a->calendar_records[i]), &(b->calendar_records[i])))
            return 0;

    for (int i = 0; i < a->fare_attributes_count; i++)
        if (!equal_fare_attributes(&(a->fare_attributes[i]), &(b->fare_attributes[i])))
            return 0;

    for (int i = 0; i < a->fare_rules_count; i++)
        if (!equal_fare_rule(&(a->fare_rules[i]), &(b->fare_rules[i])))
            return 0;

    for (int i = 0; i < a->feed_info_count; i++)
        if (!equal_feed_info(&(a->feed_info[i]), &(b->feed_info[i])))
            return 0;

    for (int i = 0; i < a->frequencies_count; i++)
        if (!equal_frequency(&(a->frequencies[i]), &(b->frequencies[i])))
            return 0;

    for (int i = 0; i < a->levels_count; i++)
        if (!equal_level(&(a->levels[i]), &(b->levels[i])))
            return 0;

    for (int i = 0; i < a->pathways_count; i++)
        if (!equal_pathway(&(a->pathways[i]), &(b->pathways[i])))
            return 0;

    for (int i = 0; i < a->routes_count; i++)
        if (!equal_route(&(a->routes[i]), &(b->routes[i])))
            return 0;

    for (int i = 0; i < a->shapes_count; i++)
        if (!equal_shape(&(a->shapes[i]), &(b->shapes[i])))
            return 0;

    for (int i = 0; i < a->stop_times_count; i++)
        if (!equal_stop_time(&(a->stop_times[i]), &(b->stop_times[i])))
            return 0;

    for (int i = 0; i < a->stops_count; i++)
        if (!equal_stop(&(a->stops[i]), &(b->stops[i])))
            return 0;

    for (int i = 0; i < a->transfers_count; i++)
        if (!equal_transfer(&(a->transfers[i]), &(b->transfers[i])))
            return 0;

    for (int i = 0; i < a->trips_count; i++)
        if (!equal_trip(&(a->trips[i]), &(b->trips[i])))
            return 0;

    return 1;
}